

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

int ncnn::conv3x3s1_winograd43(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar5;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  undefined4 uVar11;
  void *pvVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  Mat *pMVar29;
  uint uVar30;
  int iVar31;
  uint max_jj;
  uint uVar32;
  Mat *top_blob_00;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  uint max_ii;
  uint uVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  long lVar52;
  undefined1 (*pauVar53) [64];
  uint uVar54;
  int iVar55;
  int iVar56;
  undefined1 (*pauVar57) [64];
  undefined8 *puVar58;
  undefined8 *puVar59;
  int *piVar60;
  float *pfVar61;
  float *pfVar62;
  undefined1 (*pauVar63) [32];
  int iVar64;
  int iVar65;
  int m_2;
  int iVar66;
  uint uVar67;
  float *pfVar68;
  int m_4;
  int K;
  int iVar69;
  uint uVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  undefined1 (*pauVar74) [64];
  undefined1 (*pauVar75) [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  uint N;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar113;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int TILE_K;
  Mat m;
  int TILE_N;
  int TILE_M;
  float tmp [4] [6] [16];
  Allocator *_allocator;
  int local_814;
  ulong local_810;
  ulong local_808;
  ulong local_800;
  long local_7f8;
  Mat local_7f0;
  ulong local_7a8;
  ulong local_7a0;
  uint local_794;
  uint local_790;
  int local_78c;
  int local_788;
  uint local_784;
  Mat local_780;
  long local_738;
  ulong local_730;
  ulong local_728;
  Mat local_720;
  ulong local_6d8;
  ulong local_6d0;
  Mat *local_6c8;
  Mat *local_6c0;
  void *local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  ulong local_688;
  Mat local_680;
  float afStack_638 [6];
  undefined8 auStack_620 [6];
  undefined8 auStack_5f0 [2];
  float afStack_5e0 [8];
  undefined8 local_5c0 [12];
  undefined1 auStack_560 [32];
  undefined1 local_540 [64];
  undefined1 auStack_500 [192];
  undefined1 auStack_440 [192];
  undefined1 auStack_380 [384];
  undefined1 auStack_200 [384];
  undefined1 auStack_80 [80];
  undefined1 auVar112 [32];
  
  uVar1 = top_blob->w;
  uVar5 = top_blob->h;
  auVar97._4_4_ = uVar5;
  auVar97._0_4_ = uVar1;
  auVar76._8_4_ = 3;
  auVar76._0_8_ = 0x300000003;
  auVar76._12_4_ = 3;
  auVar97._8_8_ = 0;
  auVar76 = vpaddd_avx512vl(auVar97,auVar76);
  auVar97 = vpsrad_avx(auVar76,0x1f);
  auVar97 = vpsrld_avx(auVar97,0x1e);
  auVar76 = vpaddd_avx(auVar76,auVar97);
  auVar97 = vpsrad_avx(auVar76,2);
  auVar76 = vpshufd_avx(auVar97,0x55);
  auVar76 = vpmulld_avx(auVar76,auVar97);
  uVar70 = top_blob->elempack * top_blob->c;
  N = auVar76._0_4_;
  K = bottom_blob->elempack * bottom_blob->c;
  local_6c8 = AT;
  local_6c0 = bias;
  get_optimal_tile_mnk(uVar70,N,K,(int *)&local_784,&local_788,&local_814,nT);
  iVar72 = local_788;
  iVar10 = local_814;
  uVar30 = (int)(uVar70 + local_784 + -1) / (int)local_784;
  iVar64 = (int)(N + local_788 + -1) / local_788;
  iVar31 = (local_814 + K + -1) / local_814;
  iVar51 = local_814 * local_788;
  _allocator = opt->workspace_allocator;
  local_780.cstep = 0;
  local_780.data = (void *)0x0;
  local_780.refcount._0_4_ = 0;
  local_780.refcount._4_4_ = 0;
  local_780.elemsize = 0;
  local_780.elempack = 0;
  local_780.allocator = (Allocator *)0x0;
  local_780.dims = 0;
  local_780.w = 0;
  local_780.h = 0;
  local_780.d = 0;
  local_780.c = 0;
  local_6d8 = (ulong)uVar70;
  Mat::create(&local_780,iVar51,0x24,iVar31,iVar64,4,_allocator);
  iVar69 = -100;
  if ((local_780.data == (void *)0x0) || ((long)local_780.c * local_780.cstep == 0))
  goto LAB_001996e6;
  iVar64 = iVar64 * iVar31;
  iVar51 = iVar51 * 0x24;
  if ((nT < 2) || (nT <= iVar64)) {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar51,1,nT,4,opt->workspace_allocator);
    if ((local_680.data == (void *)0x0) || ((long)local_680.c * local_680.cstep == 0)) {
      piVar60 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      iVar69 = -100;
      if (piVar60 == (int *)0x0) goto LAB_001996e6;
      LOCK();
      *piVar60 = *piVar60 + -1;
      UNLOCK();
      if (*piVar60 != 0) goto LAB_001996e6;
      if (local_680.allocator != (Allocator *)0x0) {
        (*(local_680.allocator)->_vptr_Allocator[3])();
        iVar69 = -100;
        goto LAB_001996e6;
      }
      goto LAB_0019770b;
    }
    if (0 < iVar64) {
      iVar51 = 0;
      do {
        iVar48 = iVar72 * (iVar51 / iVar31);
        iVar65 = iVar10 * (iVar51 % iVar31);
        iVar69 = N - iVar48;
        if (iVar72 < iVar69) {
          iVar69 = iVar72;
        }
        iVar66 = K - iVar65;
        if (iVar10 < iVar66) {
          iVar66 = iVar10;
        }
        iVar55 = get_omp_thread_num();
        local_7f0.data =
             (void *)((long)iVar55 * local_680.cstep * local_680.elemsize + (long)local_680.data);
        local_7f0.refcount._0_4_ = 0;
        local_7f0.refcount._4_4_ = 0;
        local_7f0.elemsize = local_680.elemsize;
        local_7f0.elempack = local_680.elempack;
        local_7f0.allocator = local_680.allocator;
        local_7f0.w = local_680.w;
        local_7f0.h = local_680.h;
        local_7f0.d = 1;
        local_7f0.c = local_680.d;
        local_7f0.dims = local_680.dims + -1;
        local_7f0.cstep =
             (local_680.elemsize * (long)local_680.h * (long)local_680.w + 0xf & 0xfffffffffffffff0)
             / local_680.elemsize;
        if (local_680.dims == 4) {
          local_7f0.cstep = (long)local_680.h * (long)local_680.w;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,&local_7f0,iVar48,iVar69,iVar65,iVar66,(int)_allocator);
        local_720.cstep = (long)local_780.h * (long)local_780.w;
        local_720.data =
             (void *)((long)local_780.data +
                     (uint)(iVar51 % iVar31) * local_780.elemsize * local_720.cstep +
                     (long)(iVar51 / iVar31) * local_780.cstep * local_780.elemsize);
        local_720.refcount = (int *)0x0;
        local_720.elemsize = local_780.elemsize;
        local_720.elempack = local_780.elempack;
        local_720.allocator = local_780.allocator;
        local_720.dims = 2;
        local_720.w = local_780.w;
        local_720.h = local_780.h;
        local_720.d = 1;
        local_720.c = 1;
        transpose_pack_B_tile(&local_7f0,&local_720,0x24,iVar69,iVar66,(int)local_720.cstep);
        iVar51 = iVar51 + 1;
      } while (iVar64 != iVar51);
    }
    piVar60 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar60 != (int *)0x0) {
      LOCK();
      *piVar60 = *piVar60 + -1;
      UNLOCK();
      if (*piVar60 == 0) {
        if (local_680.allocator == (Allocator *)0x0) goto LAB_00197726;
        (*(local_680.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_680.cstep = 0;
    local_680.data = (void *)0x0;
    local_680.refcount._0_4_ = 0;
    local_680.refcount._4_4_ = 0;
    local_680.elemsize = 0;
    local_680.elempack = 0;
    local_680.allocator = (Allocator *)0x0;
    local_680.dims = 0;
    local_680.w = 0;
    local_680.h = 0;
    local_680.d = 0;
    local_680.c = 0;
    Mat::create(&local_680,iVar51,4,opt->workspace_allocator);
    if ((local_680.data == (void *)0x0) || ((long)local_680.c * local_680.cstep == 0)) {
      piVar60 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
      iVar69 = -100;
      if (piVar60 == (int *)0x0) goto LAB_001996e6;
      LOCK();
      *piVar60 = *piVar60 + -1;
      UNLOCK();
      if (*piVar60 != 0) goto LAB_001996e6;
      if (local_680.allocator != (Allocator *)0x0) {
        (*(local_680.allocator)->_vptr_Allocator[3])();
        iVar69 = -100;
        goto LAB_001996e6;
      }
LAB_0019770b:
      iVar69 = -100;
      if (local_680.data != (void *)0x0) {
        free(local_680.data);
        iVar69 = -100;
      }
      goto LAB_001996e6;
    }
    if (0 < iVar64) {
      iVar51 = 0;
      do {
        iVar48 = iVar72 * (iVar51 / iVar31);
        iVar65 = iVar10 * (int)((long)iVar51 % (long)iVar31);
        iVar69 = N - iVar48;
        if (iVar72 < iVar69) {
          iVar69 = iVar72;
        }
        iVar66 = K - iVar65;
        if (iVar10 < iVar66) {
          iVar66 = iVar10;
        }
        conv3x3s1_winograd43_transform_input_tile
                  (bottom_blob,&local_680,iVar48,iVar69,iVar65,iVar66,(int)_allocator);
        local_7f0.cstep = (long)local_780.h * (long)local_780.w;
        local_7f0.data =
             (void *)((long)local_780.data +
                     ((long)iVar51 % (long)iVar31 & 0xffffffffU) * local_780.elemsize *
                     local_7f0.cstep +
                     (long)(iVar51 / iVar31) * local_780.cstep * local_780.elemsize);
        local_7f0.refcount._0_4_ = 0;
        local_7f0.refcount._4_4_ = 0;
        local_7f0.elemsize = local_780.elemsize;
        local_7f0.elempack = local_780.elempack;
        local_7f0.allocator = local_780.allocator;
        local_7f0.dims = 2;
        local_7f0.w = local_780.w;
        local_7f0.h = local_780.h;
        local_7f0.d = 1;
        local_7f0.c = 1;
        transpose_pack_B_tile(&local_680,&local_7f0,0x24,iVar69,iVar66,(int)local_7f0.cstep);
        iVar51 = iVar51 + 1;
      } while (iVar64 != iVar51);
    }
    piVar60 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
    if (piVar60 != (int *)0x0) {
      LOCK();
      *piVar60 = *piVar60 + -1;
      UNLOCK();
      if (*piVar60 == 0) {
        if (local_680.allocator == (Allocator *)0x0) {
LAB_00197726:
          if (local_680.data != (void *)0x0) {
            free(local_680.data);
          }
        }
        else {
          (*(local_680.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  lVar71 = (long)local_788;
  local_794 = local_784;
  local_7f0.cstep = 0;
  local_7f0.data = (void *)0x0;
  local_7f0.refcount._0_4_ = 0;
  local_7f0.refcount._4_4_ = 0;
  local_7f0.elemsize = 0;
  local_7f0.elempack = 0;
  local_7f0.allocator = (Allocator *)0x0;
  local_7f0.dims = 0;
  local_7f0.w = 0;
  local_7f0.h = 0;
  local_7f0.d = 0;
  local_7f0.c = 0;
  Mat::create(&local_7f0,local_788 * local_784 * 0x24,1,nT,4,opt->workspace_allocator);
  iVar69 = -100;
  if ((local_7f0.data != (void *)0x0) && ((long)local_7f0.c * local_7f0.cstep != 0)) {
    if (0 < (int)uVar30) {
      uVar70 = 0;
      local_738 = lVar71;
      do {
        iVar51 = get_omp_thread_num();
        uVar54 = local_794 * uVar70;
        local_808 = (ulong)uVar54;
        max_ii = (int)local_6d8 - uVar54;
        if ((int)local_794 < (int)max_ii) {
          max_ii = local_794;
        }
        if (0 < (int)N) {
          top_blob_00 = (Mat *)((long)iVar51 * local_7f0.cstep * local_7f0.elemsize +
                               (long)local_7f0.data);
          lVar33 = (long)(int)uVar54;
          local_6b0 = (ulong)max_ii;
          local_7f8 = (long)(int)max_ii;
          local_800 = (ulong)uVar70;
          iVar51 = 0;
          uVar54 = N;
          do {
            pMVar29 = local_6c8;
            iVar10 = local_814;
            uVar67 = (uint)lVar71;
            uVar47 = uVar54;
            if ((int)uVar67 < (int)uVar54) {
              uVar47 = uVar67;
            }
            local_698 = (long)(int)uVar54;
            if (lVar71 < (int)uVar54) {
              local_698 = lVar71;
            }
            max_jj = N - iVar51;
            if ((int)uVar67 < (int)(N - iVar51)) {
              max_jj = uVar67;
            }
            local_790 = uVar54;
            if (0 < K) {
              iVar31 = iVar51 / (int)local_738;
              iVar69 = 0;
              iVar72 = K;
              do {
                iVar64 = iVar72;
                if (iVar10 < iVar72) {
                  iVar64 = iVar10;
                }
                local_680.w = pMVar29->w;
                local_680.h = pMVar29->h;
                local_680.elemsize = pMVar29->elemsize;
                local_680.elempack = pMVar29->elempack;
                local_680.allocator = pMVar29->allocator;
                local_680.cstep = (long)local_680.h * (long)local_680.w;
                local_680.data =
                     (void *)((long)pMVar29->data +
                             local_680.elemsize * local_680.cstep * (long)(iVar69 / iVar10) +
                             pMVar29->cstep * local_800 * local_680.elemsize);
                local_680.refcount._0_4_ = 0;
                local_680.refcount._4_4_ = 0;
                local_680.dims = 2;
                local_680.d = 1;
                local_680.c = 1;
                local_720.cstep = (long)local_780.h * (long)local_780.w;
                local_720.data =
                     (void *)((long)local_780.data +
                             local_780.elemsize * local_720.cstep * (long)(iVar69 / iVar10) +
                             local_780.cstep * (long)iVar31 * local_780.elemsize);
                local_720.refcount = (int *)0x0;
                local_720.elemsize = local_780.elemsize;
                local_720.elempack = local_780.elempack;
                local_720.allocator = local_780.allocator;
                local_720.dims = 2;
                local_720.w = local_780.w;
                local_720.h = local_780.h;
                local_720.d = 1;
                local_720.c = 1;
                iVar72 = -(iVar10 - iVar72);
                gemm_transB_packed_tile
                          (&local_680,&local_720,top_blob_00,0x24,max_ii,max_jj,iVar69,iVar64);
                iVar69 = iVar69 + iVar10;
              } while (iVar69 < K);
            }
            local_730 = (ulong)(uVar47 * 0x10);
            uVar67 = uVar47 * 0x20;
            lVar71 = (long)(int)(uVar47 * 0x10);
            iVar10 = top_blob->w;
            iVar72 = top_blob->elempack;
            iVar31 = top_blob->h;
            uVar54 = (int)top_blob->cstep * iVar72;
            local_810 = (ulong)uVar54;
            iVar69 = iVar10 + 6;
            if (-1 < iVar10 + 3) {
              iVar69 = iVar10 + 3;
            }
            iVar69 = iVar69 >> 2;
            uVar46 = 0;
            pvVar12 = local_6c0->data;
            iVar64 = (int)local_808;
            if (0xf < (int)max_ii) {
              local_78c = uVar47 * 0x240;
              local_6a0 = (long)(int)uVar54;
              lVar52 = (long)(int)(uVar54 * 2);
              lVar34 = (long)(int)(uVar54 * 3);
              lVar35 = (long)(int)(uVar54 * 4);
              lVar36 = (long)(int)(uVar54 * 5);
              lVar37 = (long)(int)(uVar54 * 6);
              lVar73 = (long)(int)(uVar54 * 8);
              lVar38 = (long)(int)(uVar54 * 7);
              lVar39 = (long)(int)(uVar54 * 9);
              lVar40 = (long)(int)(uVar54 * 10);
              lVar41 = (long)(int)(uVar54 * 0xb);
              lVar42 = (long)(int)(uVar54 * 0xc);
              lVar43 = (long)(int)(uVar54 * 0xd);
              lVar44 = (long)(int)(uVar54 * 0xe);
              lVar45 = (long)(int)(uVar54 * 0xf);
              local_6b8 = (void *)((long)pvVar12 + lVar33 * 4);
              local_6a8 = (ulong)max_jj;
              local_7a8 = 0;
              uVar46 = 0;
              do {
                local_728 = uVar46;
                if (pvVar12 == (void *)0x0) {
                  auVar84 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar84 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                               ((long)local_6b8 + local_728 * 4));
                }
                if (0 < (int)max_jj) {
                  pauVar57 = (undefined1 (*) [64])
                             ((long)&top_blob_00->data + (long)(int)local_7a8 * 4);
                  local_690 = (long)((iVar64 + (int)local_728) / iVar72);
                  uVar46 = 0;
                  do {
                    local_688 = uVar46;
                    iVar48 = iVar51 + (int)local_688;
                    lVar49 = -0x180;
                    auVar85 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
                    auVar86 = vbroadcastss_avx512f(ZEXT416(0x3fb504f3));
                    auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
                    auVar88 = vbroadcastss_avx512f(ZEXT416(0x40000000));
                    auVar89 = vbroadcastss_avx512f(ZEXT416(0x3eb504f3));
                    auVar90 = vbroadcastss_avx512f(ZEXT416(0x403504f3));
                    pauVar53 = pauVar57;
                    do {
                      auVar91 = vaddps_avx512f(*(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)uVar67 * 4),
                                               *(undefined1 (*) [64])(*pauVar53 + lVar71 * 4));
                      auVar92 = vaddps_avx512f(*(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)(uVar47 * 0x40) * 4),
                                               *(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)(uVar47 * 0x30) * 4));
                      auVar93 = vsubps_avx512f(*(undefined1 (*) [64])(*pauVar53 + lVar71 * 4),
                                               *(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)uVar67 * 4));
                      auVar94 = vsubps_avx512f(*(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)(uVar47 * 0x30) * 4),
                                               *(undefined1 (*) [64])
                                                (*pauVar53 + (long)(int)(uVar47 * 0x40) * 4));
                      auVar95 = vaddps_avx512f(auVar91,*pauVar53);
                      auVar95 = vaddps_avx512f(auVar95,auVar92);
                      auVar96 = vmulps_avx512f(auVar93,auVar85);
                      auVar96 = vfmadd231ps_avx512f(auVar96,auVar94,auVar86);
                      auVar91 = vmulps_avx512f(auVar91,auVar87);
                      auVar93 = vfmadd213ps_avx512f(auVar93,auVar89,
                                                    *(undefined1 (*) [64])
                                                     (*pauVar53 + (long)(int)(uVar47 * 0x50) * 4));
                      auVar91 = vfmadd231ps_avx512f(auVar91,auVar92,auVar88);
                      auVar92 = vfmadd231ps_avx512f(auVar93,auVar94,auVar90);
                      *(undefined1 (*) [64])(auStack_500 + lVar49) = auVar95;
                      *(undefined1 (*) [64])(auStack_380 + lVar49) = auVar96;
                      *(undefined1 (*) [64])(auStack_200 + lVar49) = auVar91;
                      *(undefined1 (*) [64])(auStack_80 + lVar49) = auVar92;
                      pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)(int)(uVar47 * 0x60) * 4);
                      lVar49 = lVar49 + 0x40;
                    } while (lVar49 != 0);
                    iVar65 = iVar48 % iVar69;
                    uVar32 = iVar48 / iVar69 << 2;
                    pauVar53 = (undefined1 (*) [64])
                               ((long)top_blob->data +
                               (long)(iVar65 * 4 * iVar72) * 4 +
                               (long)top_blob->w * top_blob->elemsize * (long)(int)uVar32 +
                               top_blob->cstep * local_690 * top_blob->elemsize);
                    iVar66 = iVar65 * 4 + 1;
                    iVar55 = iVar65 * 4 + 2;
                    iVar48 = iVar65 * 4 + 3;
                    pauVar74 = &local_540;
                    lVar49 = 0;
                    do {
                      if ((int)(uVar32 | (uint)lVar49) < iVar31) {
                        auVar87 = vaddps_avx512f(pauVar74[-3],pauVar74[-4]);
                        auVar88 = vaddps_avx512f(pauVar74[-1],pauVar74[-2]);
                        auVar90 = vsubps_avx512f(pauVar74[-4],pauVar74[-3]);
                        auVar91 = vsubps_avx512f(pauVar74[-2],pauVar74[-1]);
                        auVar85 = vaddps_avx512f(auVar84,pauVar74[-5]);
                        auVar85 = vaddps_avx512f(auVar85,auVar87);
                        auVar92 = vaddps_avx512f(auVar85,auVar88);
                        auVar85._8_4_ = 0x3f3504f3;
                        auVar85._0_8_ = 0x3f3504f33f3504f3;
                        auVar85._12_4_ = 0x3f3504f3;
                        auVar85._16_4_ = 0x3f3504f3;
                        auVar85._20_4_ = 0x3f3504f3;
                        auVar85._24_4_ = 0x3f3504f3;
                        auVar85._28_4_ = 0x3f3504f3;
                        auVar85._32_4_ = 0x3f3504f3;
                        auVar85._36_4_ = 0x3f3504f3;
                        auVar85._40_4_ = 0x3f3504f3;
                        auVar85._44_4_ = 0x3f3504f3;
                        auVar85._48_4_ = 0x3f3504f3;
                        auVar85._52_4_ = 0x3f3504f3;
                        auVar85._56_4_ = 0x3f3504f3;
                        auVar85._60_4_ = 0x3f3504f3;
                        auVar85 = vfmadd231ps_avx512f(auVar84,auVar90,auVar85);
                        auVar86._8_4_ = 0x3f000000;
                        auVar86._0_8_ = 0x3f0000003f000000;
                        auVar86._12_4_ = 0x3f000000;
                        auVar86._16_4_ = 0x3f000000;
                        auVar86._20_4_ = 0x3f000000;
                        auVar86._24_4_ = 0x3f000000;
                        auVar86._28_4_ = 0x3f000000;
                        auVar86._32_4_ = 0x3f000000;
                        auVar86._36_4_ = 0x3f000000;
                        auVar86._40_4_ = 0x3f000000;
                        auVar86._44_4_ = 0x3f000000;
                        auVar86._48_4_ = 0x3f000000;
                        auVar86._52_4_ = 0x3f000000;
                        auVar86._56_4_ = 0x3f000000;
                        auVar86._60_4_ = 0x3f000000;
                        auVar86 = vfmadd132ps_avx512f(auVar87,auVar84,auVar86);
                        auVar87._8_4_ = 0x40000000;
                        auVar87._0_8_ = 0x4000000040000000;
                        auVar87._12_4_ = 0x40000000;
                        auVar87._16_4_ = 0x40000000;
                        auVar87._20_4_ = 0x40000000;
                        auVar87._24_4_ = 0x40000000;
                        auVar87._28_4_ = 0x40000000;
                        auVar87._32_4_ = 0x40000000;
                        auVar87._36_4_ = 0x40000000;
                        auVar87._40_4_ = 0x40000000;
                        auVar87._44_4_ = 0x40000000;
                        auVar87._48_4_ = 0x40000000;
                        auVar87._52_4_ = 0x40000000;
                        auVar87._56_4_ = 0x40000000;
                        auVar87._60_4_ = 0x40000000;
                        auVar86 = vfmadd231ps_avx512f(auVar86,auVar88,auVar87);
                        auVar87 = vaddps_avx512f(auVar84,*pauVar74);
                        auVar88._8_4_ = 0x3fb504f3;
                        auVar88._0_8_ = 0x3fb504f33fb504f3;
                        auVar88._12_4_ = 0x3fb504f3;
                        auVar88._16_4_ = 0x3fb504f3;
                        auVar88._20_4_ = 0x3fb504f3;
                        auVar88._24_4_ = 0x3fb504f3;
                        auVar88._28_4_ = 0x3fb504f3;
                        auVar88._32_4_ = 0x3fb504f3;
                        auVar88._36_4_ = 0x3fb504f3;
                        auVar88._40_4_ = 0x3fb504f3;
                        auVar88._44_4_ = 0x3fb504f3;
                        auVar88._48_4_ = 0x3fb504f3;
                        auVar88._52_4_ = 0x3fb504f3;
                        auVar88._56_4_ = 0x3fb504f3;
                        auVar88._60_4_ = 0x3fb504f3;
                        auVar85 = vfmadd231ps_avx512f(auVar85,auVar91,auVar88);
                        auVar89._8_4_ = 0x3eb504f3;
                        auVar89._0_8_ = 0x3eb504f33eb504f3;
                        auVar89._12_4_ = 0x3eb504f3;
                        auVar89._16_4_ = 0x3eb504f3;
                        auVar89._20_4_ = 0x3eb504f3;
                        auVar89._24_4_ = 0x3eb504f3;
                        auVar89._28_4_ = 0x3eb504f3;
                        auVar89._32_4_ = 0x3eb504f3;
                        auVar89._36_4_ = 0x3eb504f3;
                        auVar89._40_4_ = 0x3eb504f3;
                        auVar89._44_4_ = 0x3eb504f3;
                        auVar89._48_4_ = 0x3eb504f3;
                        auVar89._52_4_ = 0x3eb504f3;
                        auVar89._56_4_ = 0x3eb504f3;
                        auVar89._60_4_ = 0x3eb504f3;
                        auVar87 = vfmadd231ps_avx512f(auVar87,auVar90,auVar89);
                        auVar90._8_4_ = 0x403504f3;
                        auVar90._0_8_ = 0x403504f3403504f3;
                        auVar90._12_4_ = 0x403504f3;
                        auVar90._16_4_ = 0x403504f3;
                        auVar90._20_4_ = 0x403504f3;
                        auVar90._24_4_ = 0x403504f3;
                        auVar90._28_4_ = 0x403504f3;
                        auVar90._32_4_ = 0x403504f3;
                        auVar90._36_4_ = 0x403504f3;
                        auVar90._40_4_ = 0x403504f3;
                        auVar90._44_4_ = 0x403504f3;
                        auVar90._48_4_ = 0x403504f3;
                        auVar90._52_4_ = 0x403504f3;
                        auVar90._56_4_ = 0x403504f3;
                        auVar90._60_4_ = 0x403504f3;
                        auVar87 = vfmadd231ps_avx512f(auVar87,auVar91,auVar90);
                        if (iVar72 < 8) {
                          auVar76 = auVar87._0_16_;
                          auVar77 = auVar92._0_16_;
                          auVar78 = auVar85._0_16_;
                          auVar97 = auVar86._0_16_;
                          if (iVar72 == 1) {
                            *(int *)*pauVar53 = auVar92._0_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar53 + local_6a0 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar53 + lVar52 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar53 + lVar34 * 4) = uVar11;
                            auVar77 = auVar92._16_16_;
                            *(int *)(*pauVar53 + lVar35 * 4) = auVar92._16_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar53 + lVar36 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar53 + lVar37 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar53 + lVar38 * 4) = uVar11;
                            auVar77 = vextracti32x4_avx512f(auVar92,2);
                            *(int *)(*pauVar53 + lVar73 * 4) = auVar77._0_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar53 + lVar39 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar53 + lVar40 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar53 + lVar41 * 4) = uVar11;
                            auVar77 = vextracti32x4_avx512f(auVar92,3);
                            *(int *)(*pauVar53 + lVar42 * 4) = auVar77._0_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar53 + lVar43 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar53 + lVar44 * 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar53 + lVar45 * 4) = uVar11;
                            if (iVar66 < iVar10) {
                              *(int *)(*pauVar53 + 4) = auVar85._0_4_;
                              uVar11 = vextractps_avx(auVar78,1);
                              *(undefined4 *)(*pauVar53 + local_6a0 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,2);
                              *(undefined4 *)(*pauVar53 + lVar52 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,3);
                              *(undefined4 *)(*pauVar53 + lVar34 * 4 + 4) = uVar11;
                              auVar78 = auVar85._16_16_;
                              *(int *)(*pauVar53 + lVar35 * 4 + 4) = auVar85._16_4_;
                              uVar11 = vextractps_avx(auVar78,1);
                              *(undefined4 *)(*pauVar53 + lVar36 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,2);
                              *(undefined4 *)(*pauVar53 + lVar37 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,3);
                              *(undefined4 *)(*pauVar53 + lVar38 * 4 + 4) = uVar11;
                              auVar78 = vextracti32x4_avx512f(auVar85,2);
                              *(int *)(*pauVar53 + lVar73 * 4 + 4) = auVar78._0_4_;
                              uVar11 = vextractps_avx(auVar78,1);
                              *(undefined4 *)(*pauVar53 + lVar39 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,2);
                              *(undefined4 *)(*pauVar53 + lVar40 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,3);
                              *(undefined4 *)(*pauVar53 + lVar41 * 4 + 4) = uVar11;
                              auVar78 = vextracti32x4_avx512f(auVar85,3);
                              *(int *)(*pauVar53 + lVar42 * 4 + 4) = auVar78._0_4_;
                              uVar11 = vextractps_avx(auVar78,1);
                              *(undefined4 *)(*pauVar53 + lVar43 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,2);
                              *(undefined4 *)(*pauVar53 + lVar44 * 4 + 4) = uVar11;
                              uVar11 = vextractps_avx(auVar78,3);
                              *(undefined4 *)(*pauVar53 + lVar45 * 4 + 4) = uVar11;
                            }
                            if (iVar55 < iVar10) {
                              *(int *)(*pauVar53 + 8) = auVar86._0_4_;
                              uVar11 = vextractps_avx(auVar97,1);
                              *(undefined4 *)(*pauVar53 + local_6a0 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,2);
                              *(undefined4 *)(*pauVar53 + lVar52 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,3);
                              *(undefined4 *)(*pauVar53 + lVar34 * 4 + 8) = uVar11;
                              auVar97 = auVar86._16_16_;
                              *(int *)(*pauVar53 + lVar35 * 4 + 8) = auVar86._16_4_;
                              uVar11 = vextractps_avx(auVar97,1);
                              *(undefined4 *)(*pauVar53 + lVar36 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,2);
                              *(undefined4 *)(*pauVar53 + lVar37 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,3);
                              *(undefined4 *)(*pauVar53 + lVar38 * 4 + 8) = uVar11;
                              auVar97 = vextracti32x4_avx512f(auVar86,2);
                              *(int *)(*pauVar53 + lVar73 * 4 + 8) = auVar97._0_4_;
                              uVar11 = vextractps_avx(auVar97,1);
                              *(undefined4 *)(*pauVar53 + lVar39 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,2);
                              *(undefined4 *)(*pauVar53 + lVar40 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,3);
                              *(undefined4 *)(*pauVar53 + lVar41 * 4 + 8) = uVar11;
                              auVar97 = vextracti32x4_avx512f(auVar86,3);
                              *(int *)(*pauVar53 + lVar42 * 4 + 8) = auVar97._0_4_;
                              uVar11 = vextractps_avx(auVar97,1);
                              *(undefined4 *)(*pauVar53 + lVar43 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,2);
                              *(undefined4 *)(*pauVar53 + lVar44 * 4 + 8) = uVar11;
                              uVar11 = vextractps_avx(auVar97,3);
                              *(undefined4 *)(*pauVar53 + lVar45 * 4 + 8) = uVar11;
                            }
                            if (iVar48 < iVar10) {
                              *(int *)(*pauVar53 + 0xc) = auVar87._0_4_;
                              uVar11 = vextractps_avx(auVar76,1);
                              *(undefined4 *)(*pauVar53 + local_6a0 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,2);
                              *(undefined4 *)(*pauVar53 + lVar52 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,3);
                              *(undefined4 *)(*pauVar53 + lVar34 * 4 + 0xc) = uVar11;
                              auVar76 = auVar87._16_16_;
                              *(int *)(*pauVar53 + lVar35 * 4 + 0xc) = auVar87._16_4_;
                              uVar11 = vextractps_avx(auVar76,1);
                              *(undefined4 *)(*pauVar53 + lVar36 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,2);
                              *(undefined4 *)(*pauVar53 + lVar37 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,3);
                              *(undefined4 *)(*pauVar53 + lVar38 * 4 + 0xc) = uVar11;
                              auVar76 = vextracti32x4_avx512f(auVar87,2);
                              *(int *)(*pauVar53 + lVar73 * 4 + 0xc) = auVar76._0_4_;
                              uVar11 = vextractps_avx(auVar76,1);
                              *(undefined4 *)(*pauVar53 + lVar39 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,2);
                              *(undefined4 *)(*pauVar53 + lVar40 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,3);
                              *(undefined4 *)(*pauVar53 + lVar41 * 4 + 0xc) = uVar11;
                              auVar76 = vextracti32x4_avx512f(auVar87,3);
                              *(int *)(*pauVar53 + lVar42 * 4 + 0xc) = auVar76._0_4_;
                              uVar11 = vextractps_avx(auVar76,1);
                              *(undefined4 *)(*pauVar53 + lVar43 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,2);
                              *(undefined4 *)(*pauVar53 + lVar44 * 4 + 0xc) = uVar11;
                              uVar11 = vextractps_avx(auVar76,3);
                              *(undefined4 *)(*pauVar53 + lVar45 * 4 + 0xc) = uVar11;
                            }
                          }
                          else if (iVar72 == 4) {
                            *(undefined1 (*) [16])*pauVar53 = auVar77;
                            auVar77 = vextractf32x4_avx512f(auVar92,1);
                            *(undefined1 (*) [16])(*pauVar53 + local_6a0 * 4) = auVar77;
                            auVar77 = vextractf32x4_avx512f(auVar92,2);
                            *(undefined1 (*) [16])(*pauVar53 + lVar52 * 4) = auVar77;
                            auVar77 = vextractf32x4_avx512f(auVar92,3);
                            *(undefined1 (*) [16])(*pauVar53 + lVar34 * 4) = auVar77;
                            if (iVar66 < iVar10) {
                              *(undefined1 (*) [16])(*pauVar53 + 0x10) = auVar78;
                              auVar78 = vextractf32x4_avx512f(auVar85,1);
                              *(undefined1 (*) [16])(*pauVar53 + local_6a0 * 4 + 8) = auVar78;
                              auVar78 = vextractf32x4_avx512f(auVar85,2);
                              *(undefined1 (*) [16])(*pauVar53 + lVar52 * 4 + 8) = auVar78;
                              auVar78 = vextractf32x4_avx512f(auVar85,3);
                              *(undefined1 (*) [16])(*pauVar53 + lVar34 * 4 + 8) = auVar78;
                            }
                            if (iVar55 < iVar10) {
                              *(undefined1 (*) [16])(*pauVar53 + 0x20) = auVar97;
                              auVar97 = vextractf32x4_avx512f(auVar86,1);
                              *(undefined1 (*) [16])(*pauVar53 + local_6a0 * 4 + 0x10) = auVar97;
                              auVar97 = vextractf32x4_avx512f(auVar86,2);
                              *(undefined1 (*) [16])(*pauVar53 + lVar52 * 4 + 0x10) = auVar97;
                              auVar97 = vextractf32x4_avx512f(auVar86,3);
                              *(undefined1 (*) [16])(*pauVar53 + lVar34 * 4 + 0x10) = auVar97;
                            }
                            if (iVar48 < iVar10) {
                              *(undefined1 (*) [16])(*pauVar53 + 0x30) = auVar76;
                              auVar76 = vextractf32x4_avx512f(auVar87,1);
                              *(undefined1 (*) [16])(*pauVar53 + local_6a0 * 4 + 0x18) = auVar76;
                              auVar76 = vextractf32x4_avx512f(auVar87,2);
                              *(undefined1 (*) [16])(*pauVar53 + lVar52 * 4 + 0x18) = auVar76;
                              auVar76 = vextractf32x4_avx512f(auVar87,3);
                              *(undefined1 (*) [16])(*pauVar53 + lVar34 * 4 + 0x18) = auVar76;
                            }
                          }
                        }
                        else if (iVar72 == 8) {
                          *(undefined1 (*) [32])*pauVar53 = auVar92._0_32_;
                          auVar80 = vextractf64x4_avx512f(auVar92,1);
                          *(undefined1 (*) [32])(*pauVar53 + local_6a0 * 4) = auVar80;
                          if (iVar66 < iVar10) {
                            *(undefined1 (*) [32])(*pauVar53 + 0x20) = auVar85._0_32_;
                            auVar80 = vextractf64x4_avx512f(auVar85,1);
                            *(undefined1 (*) [32])(*pauVar53 + local_6a0 * 4 + 0x10) = auVar80;
                          }
                          if (iVar55 < iVar10) {
                            *(undefined1 (*) [32])pauVar53[1] = auVar86._0_32_;
                            auVar80 = vextractf64x4_avx512f(auVar86,1);
                            *(undefined1 (*) [32])(*pauVar53 + local_6a0 * 4 + 0x20) = auVar80;
                          }
                          if (iVar48 < iVar10) {
                            *(undefined1 (*) [32])(pauVar53[1] + 0x20) = auVar87._0_32_;
                            auVar80 = vextractf64x4_avx512f(auVar87,1);
                            *(undefined1 (*) [32])(*pauVar53 + local_6a0 * 4 + 0x30) = auVar80;
                          }
                        }
                        else if (iVar72 == 0x10) {
                          *pauVar53 = auVar92;
                          if (iVar66 < iVar10) {
                            pauVar53[1] = auVar85;
                          }
                          if (iVar55 < iVar10) {
                            pauVar53[2] = auVar86;
                          }
                          if (iVar48 < iVar10) {
                            pauVar53[3] = auVar87;
                          }
                        }
                        pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)(iVar72 * iVar10) * 4);
                      }
                      lVar49 = lVar49 + 1;
                      pauVar74 = pauVar74 + 6;
                    } while (lVar49 != 4);
                    pauVar57 = pauVar57 + 1;
                    uVar46 = local_688 + 1;
                  } while (local_688 + 1 != local_6a8);
                }
                uVar46 = local_728 + 0x10;
                local_7a8 = (ulong)(uint)((int)local_7a8 + local_78c);
                local_6d0 = (ulong)uVar67;
              } while (local_728 + 0x1f < local_6b0);
            }
            local_7a0 = (ulong)(uVar47 * 8);
            lVar34 = (long)(int)(uVar47 * 8);
            if ((int)((uint)uVar46 | 7) < (int)max_ii) {
              lVar35 = (long)(int)uVar54;
              lVar41 = (long)(int)(uVar54 * 2);
              lVar36 = (long)(int)(uVar54 * 3);
              lVar37 = (long)(int)(uVar54 * 4);
              lVar38 = (long)(int)(uVar54 * 5);
              lVar39 = (long)(int)(uVar54 * 6);
              lVar40 = (long)(int)(uVar54 * 7);
              iVar48 = (uint)uVar46 * uVar47 * 0x24;
              uVar50 = uVar46 & 0xffffffff;
              do {
                if (pvVar12 == (void *)0x0) {
                  auVar80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                else {
                  auVar80 = *(undefined1 (*) [32])((long)pvVar12 + uVar50 * 4 + lVar33 * 4);
                }
                if (0 < (int)max_jj) {
                  pfVar61 = (float *)((long)&top_blob_00->data + (long)iVar48 * 4);
                  uVar46 = 0;
                  do {
                    iVar65 = (int)uVar46 + iVar51;
                    lVar42 = -0xc0;
                    auVar83._8_4_ = 0x3fb504f3;
                    auVar83._0_8_ = 0x3fb504f33fb504f3;
                    auVar83._12_4_ = 0x3fb504f3;
                    auVar83._16_4_ = 0x3fb504f3;
                    auVar83._20_4_ = 0x3fb504f3;
                    auVar83._24_4_ = 0x3fb504f3;
                    auVar83._28_4_ = 0x3fb504f3;
                    auVar130._8_4_ = 0x40000000;
                    auVar130._0_8_ = 0x4000000040000000;
                    auVar130._12_4_ = 0x40000000;
                    auVar130._16_4_ = 0x40000000;
                    auVar130._20_4_ = 0x40000000;
                    auVar130._24_4_ = 0x40000000;
                    auVar130._28_4_ = 0x40000000;
                    auVar81._8_4_ = 0x3eb504f3;
                    auVar81._0_8_ = 0x3eb504f33eb504f3;
                    auVar81._12_4_ = 0x3eb504f3;
                    auVar81._16_4_ = 0x3eb504f3;
                    auVar81._20_4_ = 0x3eb504f3;
                    auVar81._24_4_ = 0x3eb504f3;
                    auVar81._28_4_ = 0x3eb504f3;
                    auVar82._8_4_ = 0x403504f3;
                    auVar82._0_8_ = 0x403504f3403504f3;
                    auVar82._12_4_ = 0x403504f3;
                    auVar82._16_4_ = 0x403504f3;
                    auVar82._20_4_ = 0x403504f3;
                    auVar82._24_4_ = 0x403504f3;
                    auVar82._28_4_ = 0x403504f3;
                    pfVar62 = pfVar61;
                    do {
                      auVar6 = *(undefined1 (*) [32])(pfVar62 + lVar34);
                      auVar7 = *(undefined1 (*) [32])(pfVar62 + lVar71);
                      auVar8 = *(undefined1 (*) [32])(pfVar62 + (int)(uVar47 * 0x18));
                      auVar9 = *(undefined1 (*) [32])(pfVar62 + (int)uVar67);
                      fVar113 = auVar7._0_4_ + auVar6._0_4_;
                      fVar116 = auVar7._4_4_ + auVar6._4_4_;
                      fVar117 = auVar7._8_4_ + auVar6._8_4_;
                      fVar118 = auVar7._12_4_ + auVar6._12_4_;
                      fVar119 = auVar7._16_4_ + auVar6._16_4_;
                      fVar120 = auVar7._20_4_ + auVar6._20_4_;
                      fVar121 = auVar7._24_4_ + auVar6._24_4_;
                      fVar122 = auVar7._28_4_ + auVar6._28_4_;
                      auVar126._0_4_ = auVar9._0_4_ + auVar8._0_4_;
                      auVar126._4_4_ = auVar9._4_4_ + auVar8._4_4_;
                      auVar126._8_4_ = auVar9._8_4_ + auVar8._8_4_;
                      auVar126._12_4_ = auVar9._12_4_ + auVar8._12_4_;
                      auVar126._16_4_ = auVar9._16_4_ + auVar8._16_4_;
                      auVar126._20_4_ = auVar9._20_4_ + auVar8._20_4_;
                      auVar126._24_4_ = auVar9._24_4_ + auVar8._24_4_;
                      auVar126._28_4_ = auVar9._28_4_ + auVar8._28_4_;
                      auVar6 = vsubps_avx(auVar6,auVar7);
                      auVar7 = vsubps_avx(auVar8,auVar9);
                      auVar108._0_4_ = fVar113 + *pfVar62 + auVar126._0_4_;
                      auVar108._4_4_ = fVar116 + pfVar62[1] + auVar126._4_4_;
                      auVar108._8_4_ = fVar117 + pfVar62[2] + auVar126._8_4_;
                      auVar108._12_4_ = fVar118 + pfVar62[3] + auVar126._12_4_;
                      auVar108._16_4_ = fVar119 + pfVar62[4] + auVar126._16_4_;
                      auVar108._20_4_ = fVar120 + pfVar62[5] + auVar126._20_4_;
                      auVar108._24_4_ = fVar121 + pfVar62[6] + auVar126._24_4_;
                      auVar108._28_4_ = fVar122 + pfVar62[7] + auVar126._28_4_;
                      auVar8._4_4_ = auVar6._4_4_ * 0.70710677;
                      auVar8._0_4_ = auVar6._0_4_ * 0.70710677;
                      auVar8._8_4_ = auVar6._8_4_ * 0.70710677;
                      auVar8._12_4_ = auVar6._12_4_ * 0.70710677;
                      auVar8._16_4_ = auVar6._16_4_ * 0.70710677;
                      auVar8._20_4_ = auVar6._20_4_ * 0.70710677;
                      auVar8._24_4_ = auVar6._24_4_ * 0.70710677;
                      auVar8._28_4_ = auVar9._28_4_;
                      auVar97 = vfmadd231ps_fma(auVar8,auVar7,auVar83);
                      auVar9._4_4_ = fVar116 * 0.5;
                      auVar9._0_4_ = fVar113 * 0.5;
                      auVar9._8_4_ = fVar117 * 0.5;
                      auVar9._12_4_ = fVar118 * 0.5;
                      auVar9._16_4_ = fVar119 * 0.5;
                      auVar9._20_4_ = fVar120 * 0.5;
                      auVar9._24_4_ = fVar121 * 0.5;
                      auVar9._28_4_ = fVar122;
                      auVar76 = vfmadd213ps_fma(auVar6,auVar81,
                                                *(undefined1 (*) [32])
                                                 (pfVar62 + (int)(uVar47 * 0x28)));
                      auVar78 = vfmadd231ps_fma(auVar9,auVar126,auVar130);
                      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar82);
                      *(undefined1 (*) [32])((long)local_5c0 + lVar42) = auVar108;
                      *(undefined1 (*) [32])(auStack_500 + lVar42) = ZEXT1632(auVar97);
                      *(undefined1 (*) [32])(auStack_440 + lVar42) = ZEXT1632(auVar78);
                      *(undefined1 (*) [32])(auStack_380 + lVar42) = ZEXT1632(auVar76);
                      pfVar62 = pfVar62 + (int)(uVar47 * 0x30);
                      lVar42 = lVar42 + 0x20;
                    } while (lVar42 != 0);
                    iVar66 = iVar65 % iVar69;
                    uVar32 = iVar65 / iVar69 << 2;
                    pauVar63 = (undefined1 (*) [32])
                               ((long)top_blob->data +
                               (long)(iVar66 * 4 * iVar72) * 4 +
                               (long)top_blob->w * top_blob->elemsize * (long)(int)uVar32 +
                               top_blob->cstep * (long)((iVar64 + (int)uVar50) / iVar72) *
                               top_blob->elemsize);
                    iVar55 = iVar66 * 4 + 1;
                    iVar56 = iVar66 * 4 + 2;
                    iVar65 = iVar66 * 4 + 3;
                    pfVar62 = afStack_5e0;
                    lVar42 = 0;
                    do {
                      if ((int)(uVar32 | (uint)lVar42) < iVar31) {
                        auVar83 = *(undefined1 (*) [32])(pfVar62 + -0x20);
                        auVar130 = *(undefined1 (*) [32])(pfVar62 + -0x18);
                        auVar81 = *(undefined1 (*) [32])(pfVar62 + -0x10);
                        auVar82 = *(undefined1 (*) [32])(pfVar62 + -8);
                        auVar102._0_4_ = auVar130._0_4_ + auVar83._0_4_;
                        auVar102._4_4_ = auVar130._4_4_ + auVar83._4_4_;
                        auVar102._8_4_ = auVar130._8_4_ + auVar83._8_4_;
                        auVar102._12_4_ = auVar130._12_4_ + auVar83._12_4_;
                        auVar102._16_4_ = auVar130._16_4_ + auVar83._16_4_;
                        auVar102._20_4_ = auVar130._20_4_ + auVar83._20_4_;
                        auVar102._24_4_ = auVar130._24_4_ + auVar83._24_4_;
                        auVar102._28_4_ = auVar130._28_4_ + auVar83._28_4_;
                        auVar127._0_4_ = auVar82._0_4_ + auVar81._0_4_;
                        auVar127._4_4_ = auVar82._4_4_ + auVar81._4_4_;
                        auVar127._8_4_ = auVar82._8_4_ + auVar81._8_4_;
                        auVar127._12_4_ = auVar82._12_4_ + auVar81._12_4_;
                        auVar127._16_4_ = auVar82._16_4_ + auVar81._16_4_;
                        auVar127._20_4_ = auVar82._20_4_ + auVar81._20_4_;
                        auVar127._24_4_ = auVar82._24_4_ + auVar81._24_4_;
                        auVar127._28_4_ = auVar82._28_4_ + auVar81._28_4_;
                        auVar83 = vsubps_avx(auVar83,auVar130);
                        auVar130 = vsubps_avx(auVar81,auVar82);
                        auVar109._0_4_ =
                             auVar80._0_4_ + pfVar62[-0x28] + auVar102._0_4_ + auVar127._0_4_;
                        auVar109._4_4_ =
                             auVar80._4_4_ + pfVar62[-0x27] + auVar102._4_4_ + auVar127._4_4_;
                        auVar109._8_4_ =
                             auVar80._8_4_ + pfVar62[-0x26] + auVar102._8_4_ + auVar127._8_4_;
                        auVar109._12_4_ =
                             auVar80._12_4_ + pfVar62[-0x25] + auVar102._12_4_ + auVar127._12_4_;
                        auVar112._16_4_ =
                             auVar80._16_4_ + pfVar62[-0x24] + auVar102._16_4_ + auVar127._16_4_;
                        auVar112._0_16_ = auVar109;
                        auVar112._20_4_ =
                             auVar80._20_4_ + pfVar62[-0x23] + auVar102._20_4_ + auVar127._20_4_;
                        auVar112._24_4_ =
                             auVar80._24_4_ + pfVar62[-0x22] + auVar102._24_4_ + auVar127._24_4_;
                        auVar112._28_4_ =
                             auVar80._28_4_ + pfVar62[-0x21] + auVar102._28_4_ + auVar127._28_4_;
                        auVar6._8_4_ = 0x3f3504f3;
                        auVar6._0_8_ = 0x3f3504f33f3504f3;
                        auVar6._12_4_ = 0x3f3504f3;
                        auVar6._16_4_ = 0x3f3504f3;
                        auVar6._20_4_ = 0x3f3504f3;
                        auVar6._24_4_ = 0x3f3504f3;
                        auVar6._28_4_ = 0x3f3504f3;
                        auVar81 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar6);
                        auVar7._8_4_ = 0x3f000000;
                        auVar7._0_8_ = 0x3f0000003f000000;
                        auVar7._12_4_ = 0x3f000000;
                        auVar7._16_4_ = 0x3f000000;
                        auVar7._20_4_ = 0x3f000000;
                        auVar7._24_4_ = 0x3f000000;
                        auVar7._28_4_ = 0x3f000000;
                        auVar82 = vfmadd132ps_avx512vl(auVar102,auVar80,auVar7);
                        auVar25._8_4_ = 0x40000000;
                        auVar25._0_8_ = 0x4000000040000000;
                        auVar25._12_4_ = 0x40000000;
                        auVar25._16_4_ = 0x40000000;
                        auVar25._20_4_ = 0x40000000;
                        auVar25._24_4_ = 0x40000000;
                        auVar25._28_4_ = 0x40000000;
                        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar127,auVar25);
                        auVar99._0_4_ = auVar80._0_4_ + *pfVar62;
                        auVar99._4_4_ = auVar80._4_4_ + pfVar62[1];
                        auVar99._8_4_ = auVar80._8_4_ + pfVar62[2];
                        auVar99._12_4_ = auVar80._12_4_ + pfVar62[3];
                        auVar99._16_4_ = auVar80._16_4_ + pfVar62[4];
                        auVar99._20_4_ = auVar80._20_4_ + pfVar62[5];
                        auVar99._24_4_ = auVar80._24_4_ + pfVar62[6];
                        auVar99._28_4_ = auVar80._28_4_ + pfVar62[7];
                        auVar26._8_4_ = 0x3fb504f3;
                        auVar26._0_8_ = 0x3fb504f33fb504f3;
                        auVar26._12_4_ = 0x3fb504f3;
                        auVar26._16_4_ = 0x3fb504f3;
                        auVar26._20_4_ = 0x3fb504f3;
                        auVar26._24_4_ = 0x3fb504f3;
                        auVar26._28_4_ = 0x3fb504f3;
                        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar130,auVar26);
                        auVar27._8_4_ = 0x3eb504f3;
                        auVar27._0_8_ = 0x3eb504f33eb504f3;
                        auVar27._12_4_ = 0x3eb504f3;
                        auVar27._16_4_ = 0x3eb504f3;
                        auVar27._20_4_ = 0x3eb504f3;
                        auVar27._24_4_ = 0x3eb504f3;
                        auVar27._28_4_ = 0x3eb504f3;
                        auVar83 = vfmadd231ps_avx512vl(auVar99,auVar83,auVar27);
                        auVar28._8_4_ = 0x403504f3;
                        auVar28._0_8_ = 0x403504f3403504f3;
                        auVar28._12_4_ = 0x403504f3;
                        auVar28._16_4_ = 0x403504f3;
                        auVar28._20_4_ = 0x403504f3;
                        auVar28._24_4_ = 0x403504f3;
                        auVar28._28_4_ = 0x403504f3;
                        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar130,auVar28);
                        auVar110 = auVar112._16_16_;
                        auVar132 = auVar81._16_16_;
                        auVar77 = auVar82._16_16_;
                        auVar97 = auVar83._16_16_;
                        auVar79 = auVar81._0_16_;
                        auVar78 = auVar82._0_16_;
                        auVar76 = auVar83._0_16_;
                        if (iVar72 == 1) {
                          *(float *)*pauVar63 = auVar109._0_4_;
                          uVar11 = vextractps_avx(auVar109,1);
                          *(undefined4 *)(*pauVar63 + lVar35 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar109,2);
                          *(undefined4 *)(*pauVar63 + lVar41 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar109,3);
                          *(undefined4 *)(*pauVar63 + lVar36 * 4) = uVar11;
                          *(float *)(*pauVar63 + lVar37 * 4) = auVar112._16_4_;
                          uVar11 = vextractps_avx(auVar110,1);
                          *(undefined4 *)(*pauVar63 + lVar38 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar110,2);
                          *(undefined4 *)(*pauVar63 + lVar39 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar110,3);
                          *(undefined4 *)(*pauVar63 + lVar40 * 4) = uVar11;
                          if (iVar55 < iVar10) {
                            *(int *)(*pauVar63 + 4) = auVar81._0_4_;
                            uVar11 = vextractps_avx(auVar79,1);
                            *(undefined4 *)(*pauVar63 + lVar35 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar79,2);
                            *(undefined4 *)(*pauVar63 + lVar41 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar79,3);
                            *(undefined4 *)(*pauVar63 + lVar36 * 4 + 4) = uVar11;
                            *(int *)(*pauVar63 + lVar37 * 4 + 4) = auVar81._16_4_;
                            uVar11 = vextractps_avx(auVar132,1);
                            *(undefined4 *)(*pauVar63 + lVar38 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar132,2);
                            *(undefined4 *)(*pauVar63 + lVar39 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar132,3);
                            *(undefined4 *)(*pauVar63 + lVar40 * 4 + 4) = uVar11;
                          }
                          if (iVar56 < iVar10) {
                            *(int *)(*pauVar63 + 8) = auVar82._0_4_;
                            uVar11 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar63 + lVar35 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar63 + lVar41 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar63 + lVar36 * 4 + 8) = uVar11;
                            *(int *)(*pauVar63 + lVar37 * 4 + 8) = auVar82._16_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar63 + lVar38 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar63 + lVar39 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar63 + lVar40 * 4 + 8) = uVar11;
                          }
                          if (iVar65 < iVar10) {
                            *(int *)(*pauVar63 + 0xc) = auVar83._0_4_;
                            uVar11 = vextractps_avx(auVar76,1);
                            *(undefined4 *)(*pauVar63 + lVar35 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,2);
                            *(undefined4 *)(*pauVar63 + lVar41 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar76,3);
                            *(undefined4 *)(*pauVar63 + lVar36 * 4 + 0xc) = uVar11;
                            *(int *)(*pauVar63 + lVar37 * 4 + 0xc) = auVar83._16_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar63 + lVar38 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar63 + lVar39 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar63 + lVar40 * 4 + 0xc) = uVar11;
                          }
                        }
                        else if (iVar72 == 4) {
                          *(undefined1 (*) [16])*pauVar63 = auVar109;
                          *(undefined1 (*) [16])(*pauVar63 + lVar35 * 4) = auVar110;
                          if (iVar55 < iVar10) {
                            *(undefined1 (*) [16])(*pauVar63 + 0x10) = auVar79;
                            *(undefined1 (*) [16])(*pauVar63 + lVar35 * 4 + 0x10) = auVar132;
                          }
                          if (iVar56 < iVar10) {
                            *(undefined1 (*) [16])pauVar63[1] = auVar78;
                            *(undefined1 (*) [16])(pauVar63[1] + lVar35 * 4) = auVar77;
                          }
                          if (iVar65 < iVar10) {
                            *(undefined1 (*) [16])(pauVar63[1] + 0x10) = auVar76;
                            *(undefined1 (*) [16])(pauVar63[1] + lVar35 * 4 + 0x10) = auVar97;
                          }
                        }
                        else if (iVar72 == 8) {
                          *pauVar63 = auVar112;
                          if (iVar55 < iVar10) {
                            pauVar63[1] = auVar81;
                          }
                          if (iVar56 < iVar10) {
                            pauVar63[2] = auVar82;
                          }
                          if (iVar65 < iVar10) {
                            pauVar63[3] = auVar83;
                          }
                        }
                        pauVar63 = (undefined1 (*) [32])(*pauVar63 + (long)(iVar72 * iVar10) * 4);
                      }
                      lVar42 = lVar42 + 1;
                      pfVar62 = pfVar62 + 0x30;
                    } while (lVar42 != 4);
                    uVar46 = uVar46 + 1;
                    pfVar61 = pfVar61 + 8;
                  } while (uVar46 != max_jj);
                }
                uVar46 = uVar50 + 8;
                lVar42 = uVar50 + 0xf;
                iVar48 = iVar48 + uVar47 * 0x120;
                uVar50 = uVar46;
              } while (lVar42 < local_7f8);
            }
            lVar35 = (long)(int)(uVar47 * 4);
            if ((int)((uint)uVar46 | 3) < (int)max_ii) {
              lVar36 = (long)(int)uVar54;
              lVar37 = (long)(int)(uVar54 * 2);
              lVar38 = (long)(int)(uVar54 * 3);
              iVar48 = (uint)uVar46 * uVar47 * 0x24;
              uVar50 = uVar46 & 0xffffffff;
              do {
                if (pvVar12 == (void *)0x0) {
                  auVar76 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar76 = *(undefined1 (*) [16])((long)pvVar12 + uVar50 * 4 + lVar33 * 4);
                }
                if (0 < (int)max_jj) {
                  pfVar61 = (float *)((long)&top_blob_00->data + (long)iVar48 * 4);
                  uVar46 = 0;
                  do {
                    iVar65 = (int)uVar46 + iVar51;
                    lVar39 = -0x60;
                    auVar78._8_4_ = 0x3fb504f3;
                    auVar78._0_8_ = 0x3fb504f33fb504f3;
                    auVar78._12_4_ = 0x3fb504f3;
                    auVar77._8_4_ = 0x40000000;
                    auVar77._0_8_ = 0x4000000040000000;
                    auVar77._12_4_ = 0x40000000;
                    auVar79._8_4_ = 0x3eb504f3;
                    auVar79._0_8_ = 0x3eb504f33eb504f3;
                    auVar79._12_4_ = 0x3eb504f3;
                    auVar132._8_4_ = 0x403504f3;
                    auVar132._0_8_ = 0x403504f3403504f3;
                    auVar132._12_4_ = 0x403504f3;
                    pfVar62 = pfVar61;
                    do {
                      auVar97 = *(undefined1 (*) [16])(pfVar62 + lVar35);
                      auVar109 = *(undefined1 (*) [16])(pfVar62 + lVar34);
                      auVar110 = *(undefined1 (*) [16])(pfVar62 + (int)(uVar47 * 0xc));
                      auVar114 = *(undefined1 (*) [16])(pfVar62 + lVar71);
                      fVar113 = auVar109._0_4_ + auVar97._0_4_;
                      fVar116 = auVar109._4_4_ + auVar97._4_4_;
                      fVar117 = auVar109._8_4_ + auVar97._8_4_;
                      fVar118 = auVar109._12_4_ + auVar97._12_4_;
                      auVar123._0_4_ = auVar114._0_4_ + auVar110._0_4_;
                      auVar123._4_4_ = auVar114._4_4_ + auVar110._4_4_;
                      auVar123._8_4_ = auVar114._8_4_ + auVar110._8_4_;
                      auVar123._12_4_ = auVar114._12_4_ + auVar110._12_4_;
                      auVar97 = vsubps_avx(auVar97,auVar109);
                      auVar109 = vsubps_avx(auVar110,auVar114);
                      auVar103._0_4_ = fVar113 + *pfVar62 + auVar123._0_4_;
                      auVar103._4_4_ = fVar116 + pfVar62[1] + auVar123._4_4_;
                      auVar103._8_4_ = fVar117 + pfVar62[2] + auVar123._8_4_;
                      auVar103._12_4_ = fVar118 + pfVar62[3] + auVar123._12_4_;
                      auVar110._0_4_ = auVar97._0_4_ * 0.70710677;
                      auVar110._4_4_ = auVar97._4_4_ * 0.70710677;
                      auVar110._8_4_ = auVar97._8_4_ * 0.70710677;
                      auVar110._12_4_ = auVar97._12_4_ * 0.70710677;
                      auVar110 = vfmadd231ps_fma(auVar110,auVar109,auVar78);
                      auVar114._0_4_ = fVar113 * 0.5;
                      auVar114._4_4_ = fVar116 * 0.5;
                      auVar114._8_4_ = fVar117 * 0.5;
                      auVar114._12_4_ = fVar118 * 0.5;
                      auVar97 = vfmadd213ps_fma(auVar97,auVar79,
                                                *(undefined1 (*) [16])
                                                 (pfVar62 + (int)(uVar47 * 0x14)));
                      auVar114 = vfmadd231ps_fma(auVar114,auVar123,auVar77);
                      auVar97 = vfmadd231ps_fma(auVar97,auVar109,auVar132);
                      *(undefined1 (*) [16])((long)auStack_620 + lVar39) = auVar103;
                      *(undefined1 (*) [16])((long)local_5c0 + lVar39) = auVar110;
                      *(undefined1 (*) [16])(auStack_560 + lVar39) = auVar114;
                      *(undefined1 (*) [16])(auStack_500 + lVar39) = auVar97;
                      pfVar62 = pfVar62 + (int)(uVar47 * 0x18);
                      lVar39 = lVar39 + 0x10;
                    } while (lVar39 != 0);
                    iVar66 = iVar65 % iVar69;
                    uVar67 = iVar65 / iVar69 << 2;
                    pauVar75 = (undefined1 (*) [16])
                               ((long)top_blob->data +
                               (long)(iVar66 * 4 * iVar72) * 4 +
                               (long)top_blob->w * top_blob->elemsize * (long)(int)uVar67 +
                               top_blob->cstep * (long)((iVar64 + (int)uVar50) / iVar72) *
                               top_blob->elemsize);
                    iVar55 = iVar66 * 4 + 1;
                    iVar56 = iVar66 * 4 + 2;
                    iVar65 = iVar66 * 4 + 3;
                    pfVar62 = afStack_638 + 2;
                    lVar39 = 0;
                    do {
                      if ((int)(uVar67 | (uint)lVar39) < iVar31) {
                        auVar97 = *(undefined1 (*) [16])(pfVar62 + -0x10);
                        auVar78 = *(undefined1 (*) [16])(pfVar62 + -0xc);
                        auVar77 = *(undefined1 (*) [16])(pfVar62 + -8);
                        auVar79 = *(undefined1 (*) [16])(pfVar62 + -4);
                        auVar100._0_4_ = auVar78._0_4_ + auVar97._0_4_;
                        auVar100._4_4_ = auVar78._4_4_ + auVar97._4_4_;
                        auVar100._8_4_ = auVar78._8_4_ + auVar97._8_4_;
                        auVar100._12_4_ = auVar78._12_4_ + auVar97._12_4_;
                        auVar124._0_4_ = auVar79._0_4_ + auVar77._0_4_;
                        auVar124._4_4_ = auVar79._4_4_ + auVar77._4_4_;
                        auVar124._8_4_ = auVar79._8_4_ + auVar77._8_4_;
                        auVar124._12_4_ = auVar79._12_4_ + auVar77._12_4_;
                        auVar97 = vsubps_avx(auVar97,auVar78);
                        auVar78 = vsubps_avx(auVar77,auVar79);
                        auVar111._0_4_ =
                             auVar76._0_4_ + pfVar62[-0x14] + auVar100._0_4_ + auVar124._0_4_;
                        auVar111._4_4_ =
                             auVar76._4_4_ + pfVar62[-0x13] + auVar100._4_4_ + auVar124._4_4_;
                        auVar111._8_4_ =
                             auVar76._8_4_ + pfVar62[-0x12] + auVar100._8_4_ + auVar124._8_4_;
                        auVar111._12_4_ =
                             auVar76._12_4_ + pfVar62[-0x11] + auVar100._12_4_ + auVar124._12_4_;
                        auVar19._8_4_ = 0x3f3504f3;
                        auVar19._0_8_ = 0x3f3504f33f3504f3;
                        auVar19._12_4_ = 0x3f3504f3;
                        auVar77 = vfmadd231ps_avx512vl(auVar76,auVar97,auVar19);
                        auVar20._8_4_ = 0x3f000000;
                        auVar20._0_8_ = 0x3f0000003f000000;
                        auVar20._12_4_ = 0x3f000000;
                        auVar79 = vfmadd132ps_avx512vl(auVar100,auVar76,auVar20);
                        auVar21._8_4_ = 0x40000000;
                        auVar21._0_8_ = 0x4000000040000000;
                        auVar21._12_4_ = 0x40000000;
                        auVar79 = vfmadd231ps_avx512vl(auVar79,auVar124,auVar21);
                        auVar98._0_4_ = auVar76._0_4_ + *pfVar62;
                        auVar98._4_4_ = auVar76._4_4_ + pfVar62[1];
                        auVar98._8_4_ = auVar76._8_4_ + pfVar62[2];
                        auVar98._12_4_ = auVar76._12_4_ + pfVar62[3];
                        auVar22._8_4_ = 0x3fb504f3;
                        auVar22._0_8_ = 0x3fb504f33fb504f3;
                        auVar22._12_4_ = 0x3fb504f3;
                        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar78,auVar22);
                        auVar23._8_4_ = 0x3eb504f3;
                        auVar23._0_8_ = 0x3eb504f33eb504f3;
                        auVar23._12_4_ = 0x3eb504f3;
                        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar23);
                        auVar24._8_4_ = 0x403504f3;
                        auVar24._0_8_ = 0x403504f3403504f3;
                        auVar24._12_4_ = 0x403504f3;
                        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar78,auVar24);
                        if (iVar72 == 1) {
                          *(float *)*pauVar75 = auVar111._0_4_;
                          uVar11 = vextractps_avx(auVar111,1);
                          *(undefined4 *)(*pauVar75 + lVar36 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar111,2);
                          *(undefined4 *)(*pauVar75 + lVar37 * 4) = uVar11;
                          uVar11 = vextractps_avx(auVar111,3);
                          *(undefined4 *)(*pauVar75 + lVar38 * 4) = uVar11;
                          if (iVar55 < iVar10) {
                            *(int *)(*pauVar75 + 4) = auVar77._0_4_;
                            uVar11 = vextractps_avx(auVar77,1);
                            *(undefined4 *)(*pauVar75 + lVar36 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,2);
                            *(undefined4 *)(*pauVar75 + lVar37 * 4 + 4) = uVar11;
                            uVar11 = vextractps_avx(auVar77,3);
                            *(undefined4 *)(*pauVar75 + lVar38 * 4 + 4) = uVar11;
                          }
                          if (iVar56 < iVar10) {
                            *(int *)(*pauVar75 + 8) = auVar79._0_4_;
                            uVar11 = vextractps_avx(auVar79,1);
                            *(undefined4 *)(*pauVar75 + lVar36 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar79,2);
                            *(undefined4 *)(*pauVar75 + lVar37 * 4 + 8) = uVar11;
                            uVar11 = vextractps_avx(auVar79,3);
                            *(undefined4 *)(*pauVar75 + lVar38 * 4 + 8) = uVar11;
                          }
                          if (iVar65 < iVar10) {
                            *(int *)(*pauVar75 + 0xc) = auVar97._0_4_;
                            uVar11 = vextractps_avx(auVar97,1);
                            *(undefined4 *)(*pauVar75 + lVar36 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar97,2);
                            *(undefined4 *)(*pauVar75 + lVar37 * 4 + 0xc) = uVar11;
                            uVar11 = vextractps_avx(auVar97,3);
                            *(undefined4 *)(*pauVar75 + lVar38 * 4 + 0xc) = uVar11;
                          }
                        }
                        else if (iVar72 == 4) {
                          *pauVar75 = auVar111;
                          if (iVar55 < iVar10) {
                            pauVar75[1] = auVar77;
                          }
                          if (iVar56 < iVar10) {
                            pauVar75[2] = auVar79;
                          }
                          if (iVar65 < iVar10) {
                            pauVar75[3] = auVar97;
                          }
                        }
                        pauVar75 = (undefined1 (*) [16])(*pauVar75 + (long)(iVar72 * iVar10) * 4);
                      }
                      lVar39 = lVar39 + 1;
                      pfVar62 = pfVar62 + 0x18;
                    } while (lVar39 != 4);
                    uVar46 = uVar46 + 1;
                    pfVar61 = pfVar61 + 4;
                  } while (uVar46 != max_jj);
                }
                uVar46 = uVar50 + 4;
                lVar39 = uVar50 + 7;
                iVar48 = iVar48 + uVar47 * 0x90;
                uVar50 = uVar46;
              } while (lVar39 < local_7f8);
            }
            uVar67 = (uint)uVar46;
            if ((int)(uVar67 | 1) < (int)max_ii) {
              iVar72 = top_blob->w;
              pvVar13 = top_blob->data;
              sVar14 = top_blob->elemsize;
              sVar15 = top_blob->cstep;
              iVar64 = uVar67 * uVar47 * 0x24;
              uVar50 = (long)(int)uVar67;
              do {
                if (pvVar12 == (void *)0x0) {
                  auVar76 = ZEXT816(0) << 0x40;
                  auVar97 = (undefined1  [16])0x0;
                }
                else {
                  auVar76 = ZEXT416(*(uint *)((long)pvVar12 + (lVar33 + uVar50) * 4));
                  auVar97 = ZEXT416(*(uint *)((long)pvVar12 + (lVar33 + uVar50) * 4 + 4));
                }
                if (0 < (int)max_jj) {
                  puVar58 = (undefined8 *)((long)&top_blob_00->data + (long)iVar64 * 4);
                  uVar46 = 0;
                  do {
                    iVar48 = (int)uVar46 + iVar51;
                    lVar71 = -0x30;
                    auVar131._8_4_ = 0x40000000;
                    auVar131._0_8_ = 0x4000000040000000;
                    auVar131._12_4_ = 0x40000000;
                    puVar59 = puVar58;
                    do {
                      uVar2 = *(ulong *)((long)puVar59 + (long)(int)(uVar47 * 2) * 4);
                      auVar101._8_8_ = 0;
                      auVar101._0_8_ = uVar2;
                      uVar3 = *(ulong *)((long)puVar59 + lVar35 * 4);
                      auVar104._8_8_ = 0;
                      auVar104._0_8_ = uVar3;
                      fVar113 = (float)uVar3 + (float)uVar2;
                      fVar116 = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                      uVar2 = *(ulong *)((long)puVar59 + (long)(int)(uVar47 * 6) * 4);
                      auVar115._8_8_ = 0;
                      auVar115._0_8_ = uVar2;
                      uVar3 = *(ulong *)((long)puVar59 + lVar34 * 4);
                      auVar125._8_8_ = 0;
                      auVar125._0_8_ = uVar3;
                      auVar128._0_4_ = (float)uVar3 + (float)uVar2;
                      auVar128._4_4_ = (float)(uVar3 >> 0x20) + (float)(uVar2 >> 0x20);
                      auVar128._8_8_ = 0;
                      auVar129._0_4_ = auVar128._0_4_ + fVar113 + (float)*puVar59;
                      auVar129._4_4_ = auVar128._4_4_ + fVar116 + (float)((ulong)*puVar59 >> 0x20);
                      auVar129._8_8_ = 0;
                      uVar4 = vmovlps_avx(auVar129);
                      *(undefined8 *)((long)afStack_638 + lVar71 + -0x18) = uVar4;
                      auVar78 = vinsertps_avx(auVar115,auVar101,0x50);
                      auVar77 = vinsertps_avx(auVar125,auVar104,0x50);
                      auVar79 = vsubps_avx(auVar78,auVar77);
                      auVar78 = vinsertps_avx(auVar101,auVar115,0x50);
                      auVar77 = vinsertps_avx(auVar104,auVar125,0x50);
                      auVar78 = vsubps_avx(auVar78,auVar77);
                      auVar105._0_4_ = auVar79._0_4_ * SUB164(ZEXT816(0x3f3504f33fb504f3),0);
                      auVar105._4_4_ = auVar79._4_4_ * SUB164(ZEXT816(0x3f3504f33fb504f3),4);
                      auVar105._8_4_ = auVar79._8_4_ * 0.0;
                      auVar105._12_4_ = auVar79._12_4_ * 0.0;
                      auVar77 = vfmadd231ps_fma(auVar105,auVar78,ZEXT816(0x3fb504f33f3504f3));
                      uVar4 = vmovlps_avx(auVar77);
                      *(undefined8 *)((long)auStack_620 + lVar71) = uVar4;
                      auVar106._0_4_ = fVar113 * 0.5;
                      auVar106._4_4_ = fVar116 * 0.5;
                      auVar106._8_8_ = 0;
                      auVar77 = vfmadd231ps_fma(auVar106,auVar128,auVar131);
                      uVar4 = vmovlps_avx(auVar77);
                      *(undefined8 *)((long)auStack_5f0 + lVar71) = uVar4;
                      auVar107._8_8_ = 0;
                      auVar107._0_8_ = *(ulong *)((long)puVar59 + (long)(int)(uVar47 * 10) * 4);
                      auVar77 = vfmadd231ps_fma(auVar107,auVar79,ZEXT816(0x3eb504f3403504f3));
                      auVar78 = vfmadd231ps_fma(auVar77,auVar78,ZEXT816(0x403504f33eb504f3));
                      uVar4 = vmovlps_avx(auVar78);
                      *(undefined8 *)((long)local_5c0 + lVar71) = uVar4;
                      puVar59 = (undefined8 *)((long)puVar59 + (long)(int)(uVar47 * 0xc) * 4);
                      lVar71 = lVar71 + 8;
                    } while (lVar71 != 0);
                    iVar65 = iVar48 % iVar69;
                    uVar67 = iVar48 / iVar69 << 2;
                    pfVar61 = (float *)((long)pvVar13 +
                                       (long)(iVar65 * 4) * 4 +
                                       (long)(int)uVar67 * (long)iVar72 * sVar14 +
                                       (lVar33 + uVar50) * sVar15 * sVar14);
                    piVar60 = &local_680.w;
                    lVar71 = 0;
                    do {
                      if ((int)(uVar67 | (uint)lVar71) < iVar31) {
                        fVar113 = (float)piVar60[-5];
                        fVar116 = (float)piVar60[-4];
                        fVar117 = (float)piVar60[-3];
                        fVar118 = (float)piVar60[-2];
                        fVar122 = (float)piVar60[-7] + (float)piVar60[-9];
                        fVar16 = (float)piVar60[-6] + (float)piVar60[-8];
                        fVar17 = fVar117 + fVar113;
                        fVar18 = fVar118 + fVar116;
                        fVar119 = (float)piVar60[-10];
                        auVar110 = ZEXT416((uint)((float)piVar60[-9] - (float)piVar60[-7]));
                        auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar110,auVar76);
                        fVar120 = (float)piVar60[-1];
                        auVar109 = ZEXT416((uint)((float)piVar60[-8] - (float)piVar60[-6]));
                        auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),auVar109,auVar97);
                        fVar121 = (float)*piVar60;
                        *pfVar61 = auVar76._0_4_ + *(float *)&((Mat *)(piVar60 + -0xb))->data +
                                   fVar122 + fVar17;
                        pfVar61[(int)uVar54] = auVar97._0_4_ + fVar119 + fVar16 + fVar18;
                        auVar132 = ZEXT416((uint)(fVar116 - fVar118));
                        auVar79 = ZEXT416((uint)(fVar113 - fVar117));
                        if (iVar65 * 4 + 1 < iVar10) {
                          auVar109 = vfmadd213ss_fma(auVar109,SUB6416(ZEXT464(0x3f3504f3),0),auVar97
                                                    );
                          auVar114 = vfmadd231ss_fma(auVar109,auVar132,
                                                     SUB6416(ZEXT464(0x3fb504f3),0));
                          auVar109 = vfmadd213ss_fma(auVar110,SUB6416(ZEXT464(0x3f3504f3),0),auVar76
                                                    );
                          auVar109 = vfmadd231ss_fma(auVar109,auVar79,SUB6416(ZEXT464(0x3fb504f3),0)
                                                    );
                          pfVar61[1] = auVar109._0_4_;
                          pfVar61[(long)(int)uVar54 + 1] = auVar114._0_4_;
                        }
                        if (iVar65 * 4 + 2 < iVar10) {
                          auVar109 = vfmadd213ss_fma(ZEXT416((uint)fVar122),
                                                     SUB6416(ZEXT464(0x3f000000),0),auVar76);
                          auVar109 = vfmadd213ss_fma(ZEXT416((uint)fVar17),
                                                     SUB6416(ZEXT464(0x40000000),0),auVar109);
                          auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar16),
                                                     SUB6416(ZEXT464(0x3f000000),0),auVar97);
                          auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar18),
                                                     SUB6416(ZEXT464(0x40000000),0),auVar110);
                          pfVar61[2] = auVar109._0_4_;
                          pfVar61[(long)(int)uVar54 + 2] = auVar110._0_4_;
                        }
                        if (iVar65 * 4 + 3 < iVar10) {
                          auVar78 = vfmadd213ss_fma(auVar79,SUB6416(ZEXT464(0x403504f3),0),
                                                    ZEXT416((uint)(auVar78._0_4_ + fVar120)));
                          auVar77 = vfmadd213ss_fma(auVar132,SUB6416(ZEXT464(0x403504f3),0),
                                                    ZEXT416((uint)(auVar77._0_4_ + fVar121)));
                          pfVar61[3] = auVar78._0_4_;
                          pfVar61[(long)(int)uVar54 + 3] = auVar77._0_4_;
                        }
                        pfVar61 = pfVar61 + iVar10;
                      }
                      lVar71 = lVar71 + 1;
                      piVar60 = piVar60 + 0xc;
                    } while (lVar71 != 4);
                    uVar46 = uVar46 + 1;
                    puVar58 = puVar58 + 1;
                  } while (uVar46 != max_jj);
                }
                uVar46 = uVar50 + 2;
                lVar71 = uVar50 + 3;
                iVar64 = iVar64 + uVar47 * 0x48;
                uVar50 = uVar46;
              } while (lVar71 < local_7f8);
            }
            iVar72 = (int)uVar46;
            if (iVar72 < (int)max_ii) {
              iVar64 = top_blob->w;
              pvVar13 = top_blob->data;
              sVar14 = top_blob->elemsize;
              sVar15 = top_blob->cstep;
              lVar71 = (long)iVar72;
              iVar72 = iVar72 * uVar47 * 0x24;
              do {
                if (pvVar12 == (void *)0x0) {
                  auVar76 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar76 = ZEXT416(*(uint *)((long)pvVar12 + lVar71 * 4 + lVar33 * 4));
                }
                if (0 < (int)max_jj) {
                  pfVar61 = (float *)((long)&top_blob_00->data + (long)iVar72 * 4);
                  uVar46 = 0;
                  do {
                    iVar48 = (int)uVar46 + iVar51;
                    lVar34 = -0x18;
                    pfVar62 = pfVar61;
                    do {
                      fVar117 = pfVar62[(int)(uVar47 * 2)] + pfVar62[local_698];
                      fVar113 = pfVar62[(int)(uVar47 * 3)];
                      fVar116 = pfVar62[lVar35];
                      fVar118 = fVar116 + fVar113;
                      fVar119 = pfVar62[local_698] - pfVar62[(int)(uVar47 * 2)];
                      *(float *)((long)afStack_638 + lVar34 + -0x30) = fVar117 + *pfVar62 + fVar118;
                      auVar78 = ZEXT416((uint)(fVar113 - fVar116));
                      auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * 0.70710677)),auVar78,
                                                SUB6416(ZEXT464(0x3fb504f3),0));
                      *(int *)((long)afStack_638 + lVar34 + -0x18) = auVar97._0_4_;
                      auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * 0.5)),
                                                ZEXT416((uint)fVar118),
                                                SUB6416(ZEXT464(0x40000000),0));
                      *(int *)((long)afStack_638 + lVar34) = auVar97._0_4_;
                      auVar97 = vfmadd213ss_fma(ZEXT416((uint)fVar119),
                                                SUB6416(ZEXT464(0x3eb504f3),0),
                                                ZEXT416((uint)pfVar62[(int)(uVar47 * 5)]));
                      auVar97 = vfmadd231ss_fma(auVar97,auVar78,SUB6416(ZEXT464(0x403504f3),0));
                      *(int *)((long)auStack_620 + lVar34) = auVar97._0_4_;
                      pfVar62 = pfVar62 + (int)(uVar47 * 6);
                      lVar34 = lVar34 + 4;
                    } while (lVar34 != 0);
                    iVar65 = iVar48 % iVar69;
                    uVar54 = iVar48 / iVar69 << 2;
                    pfVar62 = (float *)((long)pvVar13 +
                                       (long)(iVar65 * 4) * 4 +
                                       (long)(int)uVar54 * (long)iVar64 * sVar14 +
                                       (lVar33 + lVar71) * sVar15 * sVar14);
                    pfVar68 = (float *)((long)&local_680.elemsize + 4);
                    lVar34 = 0;
                    do {
                      if ((int)(uVar54 | (uint)lVar34) < iVar31) {
                        fVar113 = pfVar68[-3] + pfVar68[-4];
                        fVar116 = pfVar68[-1] + pfVar68[-2];
                        auVar97 = vfmadd132ss_fma(ZEXT416((uint)fVar113),auVar76,ZEXT416(0x3f000000)
                                                 );
                        auVar77 = ZEXT416((uint)(pfVar68[-4] - pfVar68[-3]));
                        auVar78 = vfmadd231ss_fma(auVar76,auVar77,ZEXT416(0x3eb504f3));
                        auVar97 = vfmadd231ss_fma(auVar97,ZEXT416((uint)fVar116),ZEXT416(0x40000000)
                                                 );
                        auVar79 = ZEXT416((uint)(pfVar68[-2] - pfVar68[-1]));
                        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + *pfVar68)),auVar79,
                                                  ZEXT416(0x403504f3));
                        *pfVar62 = auVar76._0_4_ + pfVar68[-5] + fVar113 + fVar116;
                        if (iVar65 * 4 + 1 < iVar10) {
                          auVar77 = vfmadd132ss_fma(auVar77,auVar76,ZEXT416(0x3f3504f3));
                          auVar77 = vfmadd231ss_fma(auVar77,auVar79,ZEXT416(0x3fb504f3));
                          pfVar62[1] = auVar77._0_4_;
                        }
                        if (iVar65 * 4 + 2 < iVar10) {
                          pfVar62[2] = auVar97._0_4_;
                        }
                        if (iVar65 * 4 + 3 < iVar10) {
                          pfVar62[3] = auVar78._0_4_;
                        }
                        pfVar62 = pfVar62 + iVar10;
                      }
                      lVar34 = lVar34 + 1;
                      pfVar68 = pfVar68 + 6;
                    } while (lVar34 != 4);
                    uVar46 = uVar46 + 1;
                    pfVar61 = pfVar61 + 1;
                  } while (uVar46 != max_jj);
                }
                lVar71 = lVar71 + 1;
                iVar72 = iVar72 + uVar47 * 0x24;
              } while (lVar71 != local_7f8);
            }
            iVar51 = iVar51 + (int)local_738;
            uVar54 = local_790 - (int)local_738;
            lVar71 = local_738;
          } while (iVar51 < (int)N);
        }
        uVar70 = uVar70 + 1;
      } while (uVar70 != uVar30);
    }
    iVar69 = 0;
  }
  piVar60 = (int *)CONCAT44(local_7f0.refcount._4_4_,local_7f0.refcount._0_4_);
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + -1;
    UNLOCK();
    if (*piVar60 == 0) {
      if (local_7f0.allocator == (Allocator *)0x0) {
        if (local_7f0.data != (void *)0x0) {
          free(local_7f0.data);
        }
      }
      else {
        (*(local_7f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001996e6:
  piVar60 = (int *)CONCAT44(local_780.refcount._4_4_,local_780.refcount._0_4_);
  if (piVar60 != (int *)0x0) {
    LOCK();
    *piVar60 = *piVar60 + -1;
    UNLOCK();
    if (*piVar60 == 0) {
      if (local_780.allocator == (Allocator *)0x0) {
        if (local_780.data != (void *)0x0) {
          free(local_780.data);
        }
      }
      else {
        (*(local_780.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar69;
}

Assistant:

static int conv3x3s1_winograd43(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}